

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cpplocate::libExtensions_abi_cxx11_(void)

{
  uint in_ECX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long lVar1;
  ulong uVar2;
  uint count;
  uint *lengths;
  char **extensions;
  uint local_5c;
  uint *local_58;
  char **local_50;
  string local_48;
  
  local_50 = (char **)0x0;
  local_58 = (uint *)0x0;
  local_5c = 0;
  ::libExtensions(&local_50,&local_58,&local_5c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI,(ulong)local_5c,(allocator_type *)&local_48);
  if (local_5c != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
                (&local_48,(_anonymous_namespace_ *)local_50[uVar2],(char *)(ulong)local_58[uVar2],
                 in_ECX);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((in_RDI->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1),
                 (string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (uVar2 < local_5c);
    if (local_5c != 0) {
      free(local_50);
      free(local_58);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> libExtensions()
{
    char ** extensions = nullptr;
    unsigned int * lengths = nullptr;
    unsigned int count = 0;

    ::libExtensions(&extensions, &lengths, &count);

    // Convert c-array of c-strings and handle memory ownership
    auto result = std::vector<std::string>(count);

    for (auto i = 0u; i < count; ++i)
    {
        // Convert to string and free memory from liblocate
        result[i] = obtainStringFromLibLocate(extensions[i], lengths[i]);
    }

    if (count > 0)
    {
        free(extensions);
        free(lengths);
    }

    return result;
}